

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O0

unique_ptr<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>_>
 dispatch_new_section<(pstore::repo::section_kind)0,pstore::repo::generic_section_creation_dispatcher>
           (generic_section_creation_dispatcher *dispatcher,
           not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> buffer)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  size_t __new_size;
  size_t in_RCX;
  void *__buf;
  placement_delete<const_pstore::repo::generic_section> local_29;
  pointer local_28;
  uchar *data;
  generic_section_creation_dispatcher *dispatcher_local;
  not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> buffer_local;
  
  data = (uchar *)buffer.ptr_;
  buffer_local.ptr_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)dispatcher;
  pvVar1 = pstore::gsl::not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>::
           operator->((not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> *)
                      &dispatcher_local);
  __new_size = pstore::repo::generic_section_creation_dispatcher::size_bytes
                         ((generic_section_creation_dispatcher *)data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pvVar1,__new_size);
  pvVar1 = pstore::gsl::not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>::
           operator->((not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> *)
                      &dispatcher_local);
  local_28 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar1);
  if (local_28 != (pointer)0x0) {
    pstore::repo::generic_section_creation_dispatcher::write
              ((generic_section_creation_dispatcher *)data,(int)local_28,__buf,in_RCX);
    std::
    unique_ptr<pstore::repo::generic_section_const,placement_delete<pstore::repo::generic_section_const>>
    ::unique_ptr<placement_delete<pstore::repo::generic_section_const>,void>
              ((unique_ptr<pstore::repo::generic_section_const,placement_delete<pstore::repo::generic_section_const>>
                *)dispatcher,local_28,&local_29);
    return (__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
            )(__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
              )dispatcher;
  }
  pstore::assert_failed
            ("data != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/section_helper.hpp"
             ,0x23);
}

Assistant:

decltype (auto)
dispatch_new_section (Dispatcher const & dispatcher,
                      pstore::gsl::not_null<std::vector<std::uint8_t> *> const buffer) {
    buffer->resize (dispatcher.size_bytes ());
    auto * const data = buffer->data ();
    PSTORE_ASSERT (data != nullptr);
    dispatcher.write (data);

    using section_type = typename pstore::repo::enum_to_section_t<Kind>;

    // Use unique_ptr<> to ensure that the section_type object's destructor is called. Since
    // the memory is not owned by this object (it belongs to 'buffer'), the delete operation
    // will do nothing thanks to placement_delete<>.
    return std::unique_ptr<section_type const, placement_delete<section_type const>>{
        reinterpret_cast<section_type const *> (data), placement_delete<section_type const>{}};
}